

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O3

StringRef llvm::dwarf::AttributeString(uint Attribute)

{
  char *pcVar1;
  size_t sVar3;
  StringRef SVar5;
  char *pcVar2;
  size_t sVar4;
  
  sVar4 = 0;
  sVar3 = 0;
  pcVar2 = (char *)0x0;
  pcVar1 = (char *)0x0;
  if ((int)Attribute < 0x2101) {
    pcVar1 = pcVar2;
    sVar3 = sVar4;
    switch(Attribute) {
    case 1:
      sVar3 = 0xd;
      pcVar1 = "DW_AT_sibling";
      break;
    case 2:
      sVar3 = 0xe;
      pcVar1 = "DW_AT_location";
      break;
    case 3:
      sVar3 = 10;
      pcVar1 = "DW_AT_name";
      break;
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
    case 10:
    case 0xe:
    case 0xf:
    case 0x14:
    case 0x1f:
    case 0x23:
    case 0x24:
    case 0x26:
    case 0x28:
    case 0x29:
    case 0x2b:
    case 0x2d:
    case 0x30:
      break;
    case 9:
      sVar3 = 0xe;
      pcVar1 = "DW_AT_ordering";
      break;
    case 0xb:
      sVar3 = 0xf;
      pcVar1 = "DW_AT_byte_size";
      break;
    case 0xc:
      sVar3 = 0x10;
      pcVar1 = "DW_AT_bit_offset";
      break;
    case 0xd:
      sVar3 = 0xe;
      pcVar1 = "DW_AT_bit_size";
      break;
    case 0x10:
      sVar3 = 0xf;
      pcVar1 = "DW_AT_stmt_list";
      break;
    case 0x11:
      sVar3 = 0xc;
      pcVar1 = "DW_AT_low_pc";
      break;
    case 0x12:
      sVar3 = 0xd;
      pcVar1 = "DW_AT_high_pc";
      break;
    case 0x13:
      sVar3 = 0xe;
      pcVar1 = "DW_AT_language";
      break;
    case 0x15:
      sVar3 = 0xb;
      pcVar1 = "DW_AT_discr";
      break;
    case 0x16:
      sVar3 = 0x11;
      pcVar1 = "DW_AT_discr_value";
      break;
    case 0x17:
      sVar3 = 0x10;
      pcVar1 = "DW_AT_visibility";
      break;
    case 0x18:
      sVar3 = 0xc;
      pcVar1 = "DW_AT_import";
      break;
    case 0x19:
      sVar3 = 0x13;
      pcVar1 = "DW_AT_string_length";
      break;
    case 0x1a:
      sVar3 = 0x16;
      pcVar1 = "DW_AT_common_reference";
      break;
    case 0x1b:
      sVar3 = 0xe;
      pcVar1 = "DW_AT_comp_dir";
      break;
    case 0x1c:
      sVar3 = 0x11;
      pcVar1 = "DW_AT_const_value";
      break;
    case 0x1d:
      sVar3 = 0x15;
      pcVar1 = "DW_AT_containing_type";
      break;
    case 0x1e:
      sVar3 = 0x13;
      pcVar1 = "DW_AT_default_value";
      break;
    case 0x20:
      sVar3 = 0xc;
      pcVar1 = "DW_AT_inline";
      break;
    case 0x21:
      sVar3 = 0x11;
      pcVar1 = "DW_AT_is_optional";
      break;
    case 0x22:
      sVar3 = 0x11;
      pcVar1 = "DW_AT_lower_bound";
      break;
    case 0x25:
      sVar3 = 0xe;
      pcVar1 = "DW_AT_producer";
      break;
    case 0x27:
      sVar3 = 0x10;
      pcVar1 = "DW_AT_prototyped";
      break;
    case 0x2a:
      sVar3 = 0x11;
      pcVar1 = "DW_AT_return_addr";
      break;
    case 0x2c:
      sVar3 = 0x11;
      pcVar1 = "DW_AT_start_scope";
      break;
    case 0x2e:
      sVar3 = 0x10;
      pcVar1 = "DW_AT_bit_stride";
      break;
    case 0x2f:
      sVar3 = 0x11;
      pcVar1 = "DW_AT_upper_bound";
      break;
    case 0x31:
      sVar3 = 0x15;
      pcVar1 = "DW_AT_abstract_origin";
      break;
    case 0x32:
      sVar3 = 0x13;
      pcVar1 = "DW_AT_accessibility";
      break;
    case 0x33:
      sVar3 = 0x13;
      pcVar1 = "DW_AT_address_class";
      break;
    case 0x34:
      sVar3 = 0x10;
      pcVar1 = "DW_AT_artificial";
      break;
    case 0x35:
      sVar3 = 0x10;
      pcVar1 = "DW_AT_base_types";
      break;
    case 0x36:
      sVar3 = 0x18;
      pcVar1 = "DW_AT_calling_convention";
      break;
    case 0x37:
      sVar3 = 0xb;
      pcVar1 = "DW_AT_count";
      break;
    case 0x38:
      sVar3 = 0x1a;
      pcVar1 = "DW_AT_data_member_location";
      break;
    case 0x39:
      sVar3 = 0x11;
      pcVar1 = "DW_AT_decl_column";
      break;
    case 0x3a:
      sVar3 = 0xf;
      pcVar1 = "DW_AT_decl_file";
      break;
    case 0x3b:
      sVar3 = 0xf;
      pcVar1 = "DW_AT_decl_line";
      break;
    case 0x3c:
      sVar3 = 0x11;
      pcVar1 = "DW_AT_declaration";
      break;
    case 0x3d:
      sVar3 = 0x10;
      pcVar1 = "DW_AT_discr_list";
      break;
    case 0x3e:
      sVar3 = 0xe;
      pcVar1 = "DW_AT_encoding";
      break;
    case 0x3f:
      sVar3 = 0xe;
      pcVar1 = "DW_AT_external";
      break;
    case 0x40:
      sVar3 = 0x10;
      pcVar1 = "DW_AT_frame_base";
      break;
    case 0x41:
      sVar3 = 0xc;
      pcVar1 = "DW_AT_friend";
      break;
    case 0x42:
      sVar3 = 0x15;
      pcVar1 = "DW_AT_identifier_case";
      break;
    case 0x43:
      sVar3 = 0x10;
      pcVar1 = "DW_AT_macro_info";
      break;
    case 0x44:
      sVar3 = 0x13;
      pcVar1 = "DW_AT_namelist_item";
      break;
    case 0x45:
      sVar3 = 0xe;
      pcVar1 = "DW_AT_priority";
      break;
    case 0x46:
      sVar3 = 0xd;
      pcVar1 = "DW_AT_segment";
      break;
    case 0x47:
      sVar3 = 0x13;
      pcVar1 = "DW_AT_specification";
      break;
    case 0x48:
      sVar3 = 0x11;
      pcVar1 = "DW_AT_static_link";
      break;
    case 0x49:
      sVar3 = 10;
      pcVar1 = "DW_AT_type";
      break;
    case 0x4a:
      sVar3 = 0x12;
      pcVar1 = "DW_AT_use_location";
      break;
    case 0x4b:
      sVar3 = 0x18;
      pcVar1 = "DW_AT_variable_parameter";
      break;
    case 0x4c:
      sVar3 = 0x10;
      pcVar1 = "DW_AT_virtuality";
      break;
    case 0x4d:
      sVar3 = 0x1a;
      pcVar1 = "DW_AT_vtable_elem_location";
      break;
    case 0x4e:
      sVar3 = 0xf;
      pcVar1 = "DW_AT_allocated";
      break;
    case 0x4f:
      sVar3 = 0x10;
      pcVar1 = "DW_AT_associated";
      break;
    case 0x50:
      sVar3 = 0x13;
      pcVar1 = "DW_AT_data_location";
      break;
    case 0x51:
      sVar3 = 0x11;
      pcVar1 = "DW_AT_byte_stride";
      break;
    case 0x52:
      sVar3 = 0xe;
      pcVar1 = "DW_AT_entry_pc";
      break;
    case 0x53:
      sVar3 = 0xe;
      pcVar1 = "DW_AT_use_UTF8";
      break;
    case 0x54:
      sVar3 = 0xf;
      pcVar1 = "DW_AT_extension";
      break;
    case 0x55:
      sVar3 = 0xc;
      pcVar1 = "DW_AT_ranges";
      break;
    case 0x56:
      sVar3 = 0x10;
      pcVar1 = "DW_AT_trampoline";
      break;
    case 0x57:
      sVar3 = 0x11;
      pcVar1 = "DW_AT_call_column";
      break;
    case 0x58:
      sVar3 = 0xf;
      pcVar1 = "DW_AT_call_file";
      break;
    case 0x59:
      sVar3 = 0xf;
      pcVar1 = "DW_AT_call_line";
      break;
    case 0x5a:
      sVar3 = 0x11;
      pcVar1 = "DW_AT_description";
      break;
    case 0x5b:
      sVar3 = 0x12;
      pcVar1 = "DW_AT_binary_scale";
      break;
    case 0x5c:
      sVar3 = 0x13;
      pcVar1 = "DW_AT_decimal_scale";
      break;
    case 0x5d:
      sVar3 = 0xb;
      pcVar1 = "DW_AT_small";
      break;
    case 0x5e:
      sVar3 = 0x12;
      pcVar1 = "DW_AT_decimal_sign";
      break;
    case 0x5f:
      sVar3 = 0x11;
      pcVar1 = "DW_AT_digit_count";
      break;
    case 0x60:
      sVar3 = 0x14;
      pcVar1 = "DW_AT_picture_string";
      break;
    case 0x61:
      sVar3 = 0xd;
      pcVar1 = "DW_AT_mutable";
      break;
    case 0x62:
      sVar3 = 0x14;
      pcVar1 = "DW_AT_threads_scaled";
      break;
    case 99:
      sVar3 = 0xe;
      pcVar1 = "DW_AT_explicit";
      break;
    case 100:
      sVar3 = 0x14;
      pcVar1 = "DW_AT_object_pointer";
      break;
    case 0x65:
      sVar3 = 0xf;
      pcVar1 = "DW_AT_endianity";
      break;
    case 0x66:
      sVar3 = 0xf;
      pcVar1 = "DW_AT_elemental";
      break;
    case 0x67:
      sVar3 = 10;
      pcVar1 = "DW_AT_pure";
      break;
    case 0x68:
      sVar3 = 0xf;
      pcVar1 = "DW_AT_recursive";
      break;
    case 0x69:
      sVar3 = 0xf;
      pcVar1 = "DW_AT_signature";
      break;
    case 0x6a:
      sVar3 = 0x15;
      pcVar1 = "DW_AT_main_subprogram";
      break;
    case 0x6b:
      sVar3 = 0x15;
      pcVar1 = "DW_AT_data_bit_offset";
      break;
    case 0x6c:
      sVar3 = 0x10;
      pcVar1 = "DW_AT_const_expr";
      break;
    case 0x6d:
      sVar3 = 0x10;
      pcVar1 = "DW_AT_enum_class";
      break;
    case 0x6e:
      sVar3 = 0x12;
      pcVar1 = "DW_AT_linkage_name";
      break;
    case 0x6f:
      sVar3 = 0x1c;
      pcVar1 = "DW_AT_string_length_bit_size";
      break;
    case 0x70:
      sVar3 = 0x1d;
      pcVar1 = "DW_AT_string_length_byte_size";
      break;
    case 0x71:
      sVar3 = 10;
      pcVar1 = "DW_AT_rank";
      break;
    case 0x72:
      sVar3 = 0x16;
      pcVar1 = "DW_AT_str_offsets_base";
      break;
    case 0x73:
      sVar3 = 0xf;
      pcVar1 = "DW_AT_addr_base";
      break;
    case 0x74:
      sVar3 = 0x13;
      pcVar1 = "DW_AT_rnglists_base";
      break;
    case 0x75:
      sVar3 = 0xc;
      pcVar1 = "DW_AT_dwo_id";
      break;
    case 0x76:
      sVar3 = 0xe;
      pcVar1 = "DW_AT_dwo_name";
      break;
    case 0x77:
      sVar3 = 0xf;
      pcVar1 = "DW_AT_reference";
      break;
    case 0x78:
      sVar3 = 0x16;
      pcVar1 = "DW_AT_rvalue_reference";
      break;
    case 0x79:
      sVar3 = 0xc;
      pcVar1 = "DW_AT_macros";
      break;
    case 0x7a:
      sVar3 = 0x14;
      pcVar1 = "DW_AT_call_all_calls";
      break;
    case 0x7b:
      sVar3 = 0x1b;
      pcVar1 = "DW_AT_call_all_source_calls";
      break;
    case 0x7c:
      sVar3 = 0x19;
      pcVar1 = "DW_AT_call_all_tail_calls";
      break;
    case 0x7d:
      sVar3 = 0x14;
      pcVar1 = "DW_AT_call_return_pc";
      break;
    case 0x7e:
      sVar3 = 0x10;
      pcVar1 = "DW_AT_call_value";
      break;
    case 0x7f:
      sVar3 = 0x11;
      pcVar1 = "DW_AT_call_origin";
      break;
    case 0x80:
      sVar3 = 0x14;
      pcVar1 = "DW_AT_call_parameter";
      break;
    case 0x81:
      sVar3 = 0xd;
      pcVar1 = "DW_AT_call_pc";
      break;
    case 0x82:
      sVar3 = 0x14;
      pcVar1 = "DW_AT_call_tail_call";
      break;
    case 0x83:
      sVar3 = 0x11;
      pcVar1 = "DW_AT_call_target";
      break;
    case 0x84:
      sVar3 = 0x1b;
      pcVar1 = "DW_AT_call_target_clobbered";
      break;
    case 0x85:
      sVar3 = 0x18;
      pcVar1 = "DW_AT_call_data_location";
      break;
    case 0x86:
      sVar3 = 0x15;
      pcVar1 = "DW_AT_call_data_value";
      break;
    case 0x87:
      sVar3 = 0xe;
      pcVar1 = "DW_AT_noreturn";
      break;
    case 0x88:
      sVar3 = 0xf;
      pcVar1 = "DW_AT_alignment";
      break;
    case 0x89:
      sVar3 = 0x14;
      pcVar1 = "DW_AT_export_symbols";
      break;
    case 0x8a:
      sVar3 = 0xd;
      pcVar1 = "DW_AT_deleted";
      break;
    case 0x8b:
      sVar3 = 0xf;
      pcVar1 = "DW_AT_defaulted";
      break;
    case 0x8c:
      sVar3 = 0x13;
      pcVar1 = "DW_AT_loclists_base";
      break;
    default:
      switch(Attribute) {
      case 0x2002:
        sVar3 = 0x15;
        pcVar1 = "DW_AT_MIPS_loop_begin";
        break;
      case 0x2003:
        sVar3 = 0x1a;
        pcVar1 = "DW_AT_MIPS_tail_loop_begin";
        break;
      case 0x2004:
        sVar3 = 0x17;
        pcVar1 = "DW_AT_MIPS_epilog_begin";
        break;
      case 0x2005:
        sVar3 = 0x1d;
        pcVar1 = "DW_AT_MIPS_loop_unroll_factor";
        break;
      case 0x2006:
        sVar3 = 0x22;
        pcVar1 = "DW_AT_MIPS_software_pipeline_depth";
        break;
      case 0x2007:
        sVar3 = 0x17;
        pcVar1 = "DW_AT_MIPS_linkage_name";
        break;
      case 0x2008:
        sVar3 = 0x11;
        pcVar1 = "DW_AT_MIPS_stride";
        break;
      case 0x2009:
        sVar3 = 0x18;
        pcVar1 = "DW_AT_MIPS_abstract_name";
        break;
      case 0x200a:
        sVar3 = 0x17;
        pcVar1 = "DW_AT_MIPS_clone_origin";
        break;
      case 0x200b:
        sVar3 = 0x16;
        pcVar1 = "DW_AT_MIPS_has_inlines";
        break;
      case 0x200c:
        sVar3 = 0x16;
        pcVar1 = "DW_AT_MIPS_stride_byte";
        break;
      case 0x200d:
        sVar3 = 0x16;
        pcVar1 = "DW_AT_MIPS_stride_elem";
        break;
      case 0x200e:
        sVar3 = 0x17;
        pcVar1 = "DW_AT_MIPS_ptr_dopetype";
        break;
      case 0x200f:
        sVar3 = 0x1f;
        pcVar1 = "DW_AT_MIPS_allocatable_dopetype";
        break;
      case 0x2010:
        sVar3 = 0x21;
        pcVar1 = "DW_AT_MIPS_assumed_shape_dopetype";
        break;
      case 0x2011:
        sVar3 = 0x17;
        pcVar1 = "DW_AT_MIPS_assumed_size";
      }
    }
  }
  else if ((int)Attribute < 0x3b11) {
    switch(Attribute) {
    case 0x2101:
      sVar3 = 0xe;
      pcVar1 = "DW_AT_sf_names";
      break;
    case 0x2102:
      sVar3 = 0xe;
      pcVar1 = "DW_AT_src_info";
      break;
    case 0x2103:
      sVar3 = 0xe;
      pcVar1 = "DW_AT_mac_info";
      break;
    case 0x2104:
      sVar3 = 0x10;
      pcVar1 = "DW_AT_src_coords";
      break;
    case 0x2105:
      sVar3 = 0x10;
      pcVar1 = "DW_AT_body_begin";
      break;
    case 0x2106:
      sVar3 = 0xe;
      pcVar1 = "DW_AT_body_end";
      break;
    case 0x2107:
      sVar3 = 0x10;
      pcVar1 = "DW_AT_GNU_vector";
      break;
    case 0x210f:
      sVar3 = 0x17;
      pcVar1 = "DW_AT_GNU_odr_signature";
      break;
    case 0x2110:
      sVar3 = 0x17;
      pcVar1 = "DW_AT_GNU_template_name";
      break;
    case 0x2111:
      sVar3 = 0x19;
      pcVar1 = "DW_AT_GNU_call_site_value";
      break;
    case 0x2112:
      sVar3 = 0x1e;
      pcVar1 = "DW_AT_GNU_call_site_data_value";
      break;
    case 0x2113:
      sVar3 = 0x1a;
      pcVar1 = "DW_AT_GNU_call_site_target";
      break;
    case 0x2114:
      sVar3 = 0x24;
      pcVar1 = "DW_AT_GNU_call_site_target_clobbered";
      break;
    case 0x2115:
      sVar3 = 0x13;
      pcVar1 = "DW_AT_GNU_tail_call";
      break;
    case 0x2116:
      sVar3 = 0x1d;
      pcVar1 = "DW_AT_GNU_all_tail_call_sites";
      break;
    case 0x2117:
      sVar3 = 0x18;
      pcVar1 = "DW_AT_GNU_all_call_sites";
      break;
    case 0x2118:
      sVar3 = 0x1f;
      pcVar1 = "DW_AT_GNU_all_source_call_sites";
      break;
    case 0x2119:
      sVar3 = 0x10;
      pcVar1 = "DW_AT_GNU_macros";
      break;
    case 0x2130:
      sVar3 = 0x12;
      pcVar1 = "DW_AT_GNU_dwo_name";
      break;
    case 0x2131:
      sVar3 = 0x10;
      pcVar1 = "DW_AT_GNU_dwo_id";
      break;
    case 0x2132:
      sVar3 = 0x15;
      pcVar1 = "DW_AT_GNU_ranges_base";
      break;
    case 0x2133:
      sVar3 = 0x13;
      pcVar1 = "DW_AT_GNU_addr_base";
      break;
    case 0x2134:
      sVar3 = 0x12;
      pcVar1 = "DW_AT_GNU_pubnames";
      break;
    case 0x2135:
      sVar3 = 0x12;
      pcVar1 = "DW_AT_GNU_pubtypes";
      break;
    case 0x2136:
      sVar3 = 0x17;
      pcVar1 = "DW_AT_GNU_discriminator";
    }
  }
  else {
    switch(Attribute) {
    case 0x3b11:
      sVar3 = 0x1b;
      pcVar1 = "DW_AT_BORLAND_property_read";
      break;
    case 0x3b12:
      sVar3 = 0x1c;
      pcVar1 = "DW_AT_BORLAND_property_write";
      break;
    case 0x3b13:
      sVar3 = 0x21;
      pcVar1 = "DW_AT_BORLAND_property_implements";
      break;
    case 0x3b14:
      sVar3 = 0x1c;
      pcVar1 = "DW_AT_BORLAND_property_index";
      break;
    case 0x3b15:
      sVar3 = 0x1e;
      pcVar1 = "DW_AT_BORLAND_property_default";
      break;
    case 0x3b16:
    case 0x3b17:
    case 0x3b18:
    case 0x3b19:
    case 0x3b1a:
    case 0x3b1b:
    case 0x3b1c:
    case 0x3b1d:
    case 0x3b1e:
    case 0x3b1f:
    case 0x3b2a:
    case 0x3b2b:
    case 0x3b2c:
    case 0x3b2d:
    case 0x3b2e:
    case 0x3b2f:
      break;
    case 0x3b20:
      sVar3 = 0x19;
      pcVar1 = "DW_AT_BORLAND_Delphi_unit";
      break;
    case 0x3b21:
      sVar3 = 0x1a;
      pcVar1 = "DW_AT_BORLAND_Delphi_class";
      break;
    case 0x3b22:
      sVar3 = 0x1b;
      pcVar1 = "DW_AT_BORLAND_Delphi_record";
      break;
    case 0x3b23:
      sVar3 = 0x1e;
      pcVar1 = "DW_AT_BORLAND_Delphi_metaclass";
      break;
    case 0x3b24:
      sVar3 = 0x20;
      pcVar1 = "DW_AT_BORLAND_Delphi_constructor";
      break;
    case 0x3b25:
      sVar3 = 0x1f;
      pcVar1 = "DW_AT_BORLAND_Delphi_destructor";
      break;
    case 0x3b26:
      sVar3 = 0x25;
      pcVar1 = "DW_AT_BORLAND_Delphi_anonymous_method";
      break;
    case 0x3b27:
      sVar3 = 0x1e;
      pcVar1 = "DW_AT_BORLAND_Delphi_interface";
      break;
    case 0x3b28:
      sVar3 = 0x18;
      pcVar1 = "DW_AT_BORLAND_Delphi_ABI";
      break;
    case 0x3b29:
      sVar3 = 0x1b;
      pcVar1 = "DW_AT_BORLAND_Delphi_return";
      break;
    case 0x3b30:
      sVar3 = 0x1d;
      pcVar1 = "DW_AT_BORLAND_Delphi_frameptr";
      break;
    case 0x3b31:
      sVar3 = 0x15;
      pcVar1 = "DW_AT_BORLAND_closure";
      break;
    default:
      switch(Attribute) {
      case 0x3fe1:
        sVar3 = 0x15;
        pcVar1 = "DW_AT_APPLE_optimized";
        break;
      case 0x3fe2:
        sVar3 = 0x11;
        pcVar1 = "DW_AT_APPLE_flags";
        break;
      case 0x3fe3:
        sVar3 = 0xf;
        pcVar1 = "DW_AT_APPLE_isa";
        break;
      case 0x3fe4:
        sVar3 = 0x11;
        pcVar1 = "DW_AT_APPLE_block";
        break;
      case 0x3fe5:
        sVar3 = 0x1e;
        pcVar1 = "DW_AT_APPLE_major_runtime_vers";
        break;
      case 0x3fe6:
        sVar3 = 0x19;
        pcVar1 = "DW_AT_APPLE_runtime_class";
        break;
      case 0x3fe7:
        sVar3 = 0x1a;
        pcVar1 = "DW_AT_APPLE_omit_frame_ptr";
        break;
      case 0x3fe8:
        sVar3 = 0x19;
        pcVar1 = "DW_AT_APPLE_property_name";
        break;
      case 0x3fe9:
        sVar3 = 0x1b;
        pcVar1 = "DW_AT_APPLE_property_getter";
        break;
      case 0x3fea:
        sVar3 = 0x1b;
        pcVar1 = "DW_AT_APPLE_property_setter";
        break;
      case 0x3feb:
        sVar3 = 0x1e;
        pcVar1 = "DW_AT_APPLE_property_attribute";
        break;
      case 0x3fec:
        sVar3 = 0x1e;
        pcVar1 = "DW_AT_APPLE_objc_complete_type";
        break;
      case 0x3fed:
        sVar3 = 0x14;
        pcVar1 = "DW_AT_APPLE_property";
        break;
      default:
        pcVar1 = pcVar2;
        sVar3 = sVar4;
        switch(Attribute) {
        case 0x3e00:
          sVar3 = 0x17;
          pcVar1 = "DW_AT_LLVM_include_path";
          break;
        case 0x3e01:
          sVar3 = 0x18;
          pcVar1 = "DW_AT_LLVM_config_macros";
          break;
        case 0x3e02:
          sVar3 = 0x13;
          pcVar1 = "DW_AT_LLVM_isysroot";
          break;
        case 0x3e03:
          sVar3 = 0x15;
          pcVar1 = "DW_AT_LLVM_tag_offset";
        }
      }
    }
  }
  SVar5.Length = sVar3;
  SVar5.Data = pcVar1;
  return SVar5;
}

Assistant:

StringRef llvm::dwarf::AttributeString(unsigned Attribute) {
  switch (Attribute) {
  default:
    return StringRef();
#define HANDLE_DW_AT(ID, NAME, VERSION, VENDOR)                                \
  case DW_AT_##NAME:                                                           \
    return "DW_AT_" #NAME;
#include "llvm/BinaryFormat/Dwarf.def"
  }
}